

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_img_stats_float
              (float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngoodpix,
              float *minvalue,float *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  double local_88;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double xnoise;
  double xsigma;
  double xmean;
  float maxval;
  float minval;
  long ngood;
  float *minvalue_local;
  long *ngoodpix_local;
  float nullvalue_local;
  int nullcheck_local;
  long ny_local;
  long nx_local;
  float *array_local;
  
  xsigma = 0.0;
  xnoise = 0.0;
  xnoise2 = 0.0;
  xnoise3 = 0.0;
  xnoise5 = 0.0;
  local_88 = 0.0;
  ngood = (long)minvalue;
  minvalue_local = (float *)ngoodpix;
  ngoodpix_local._0_4_ = nullvalue;
  ngoodpix_local._4_4_ = nullcheck;
  _nullvalue_local = ny;
  ny_local = nx;
  nx_local = (long)array;
  if ((mean != (double *)0x0) || (sigma != (double *)0x0)) {
    FnMeanSigma_float(array,nx * ny,nullcheck,nullvalue,(long *)&maxval,&xsigma,&xnoise,status);
    if (minvalue_local != (float *)0x0) {
      *(undefined8 *)minvalue_local = _maxval;
    }
    if (mean != (double *)0x0) {
      *mean = xsigma;
    }
    if (sigma != (double *)0x0) {
      *sigma = xnoise;
    }
  }
  if (noise1 != (double *)0x0) {
    FnNoise1_float((float *)nx_local,ny_local,_nullvalue_local,ngoodpix_local._4_4_,
                   ngoodpix_local._0_4_,&xnoise2,status);
    *noise1 = xnoise2;
  }
  if (((ngood != 0) || (maxvalue != (float *)0x0)) || (noise3 != (double *)0x0)) {
    FnNoise5_float((float *)nx_local,ny_local,_nullvalue_local,ngoodpix_local._4_4_,
                   ngoodpix_local._0_4_,(long *)&maxval,(float *)((long)&xmean + 4),(float *)&xmean,
                   &xnoise3,&xnoise5,&local_88,status);
    if (minvalue_local != (float *)0x0) {
      *(undefined8 *)minvalue_local = _maxval;
    }
    if (ngood != 0) {
      *(undefined4 *)ngood = xmean._4_4_;
    }
    if (maxvalue != (float *)0x0) {
      *maxvalue = xmean._0_4_;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = xnoise3;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = xnoise5;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = local_88;
    }
  }
  return *status;
}

Assistant:

int fits_img_stats_float(float *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	float *minvalue,    /* returned minimum non-null value in the array */
	float *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input float image.
*/
{
	long ngood;
	float minval, maxval;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_float(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_float(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_float(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}